

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int try_psk_handshake(ptls_t *tls,size_t *psk_index,int *accept_early_data,
                     st_ptls_client_hello_t *ch,ptls_iovec_t ch_trunc,int is_second_flight)

{
  ptls_iovec_t *ppVar1;
  uint16_t uVar2;
  st_ptls_get_time_t *psVar3;
  ptls_context_t *ppVar4;
  uint8_t *puVar5;
  st_ptls_encrypt_ticket_t *psVar6;
  ptls_key_exchange_algorithm_t *ppVar7;
  size_t sVar8;
  ptls_hash_algorithm_t *algo;
  ptls_key_schedule_t *ppVar9;
  ptls_iovec_t hash_value;
  ptls_iovec_t ikm;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ptls_key_exchange_algorithm_t **pppVar13;
  char *pcVar14;
  byte bVar15;
  size_t sVar16;
  ulong uVar17;
  ptls_hash_context_t **pppVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ptls_iovec_t secret_00;
  uint16_t ticket_csid;
  uint16_t ticket_key_exchange_id;
  uint32_t age_add;
  ptls_iovec_t secret;
  ptls_iovec_t ticket_ctx;
  uint64_t issue_at;
  ptls_iovec_t ticket_negotiated_protocol;
  uint8_t binder_key [64];
  uint16_t local_11c;
  uint16_t local_11a;
  uint *local_118;
  uint32_t local_10c;
  ptls_buffer_t local_108;
  uint64_t local_e0;
  ptls_iovec_t local_d8;
  ptls_iovec_t local_c0;
  uint8_t *local_b0;
  size_t local_a8;
  ulong local_a0;
  ptls_iovec_t local_98;
  uint8_t *local_88;
  size_t sStack_80;
  undefined1 local_78 [72];
  
  local_a8 = ch_trunc.len;
  local_b0 = ch_trunc.base;
  psVar3 = tls->ctx->get_time;
  local_118 = (uint *)accept_early_data;
  local_e0 = (*psVar3->cb)(psVar3);
  local_108.base = "";
  local_108.capacity = 0;
  local_108.off = 0;
  local_108.is_allocated = '\0';
  local_108.align_bits = '\0';
  *psk_index = 0;
  if ((ch->psk).identities.count == 0) {
LAB_0012fb88:
    *psk_index = 0xffffffffffffffff;
    *local_118 = 0;
    tls->key_share = (ptls_key_exchange_algorithm_t *)0x0;
    ch = (st_ptls_client_hello_t *)0x0;
  }
  else {
    uVar17 = 0;
LAB_0012f7f4:
    ppVar1 = &(ch->psk).identities.list[uVar17].identity;
    ppVar4 = tls->ctx;
    puVar5 = (ppVar4->pre_shared_key).identity.base;
    if (puVar5 == (uint8_t *)0x0) {
      psVar6 = ppVar4->encrypt_ticket;
      bVar15 = 4;
      if ((psVar6 != (st_ptls_encrypt_ticket_t *)0x0) &&
         (ppVar4->key_exchanges != (ptls_key_exchange_algorithm_t **)0x0)) {
        bVar19 = uVar17 == 0;
        local_108.off = 0;
        iVar10 = (*psVar6->cb)(psVar6,tls,0,&local_108,*ppVar1);
        if (iVar10 == 0) {
LAB_0012f8c1:
          iVar10 = decode_session_identifier
                             (&local_a0,&local_d8,&local_10c,&local_c0,&local_11a,&local_11c,
                              &local_98,local_108.base,local_108.base + local_108.off);
          sVar8 = local_c0.len;
          if (((iVar10 == 0) && (local_a0 <= local_e0)) &&
             (ppVar4 = tls->ctx, local_e0 - local_a0 <= (ulong)ppVar4->ticket_lifetime * 1000)) {
            *local_118 = 0;
            if (!(bool)(bVar19 ^ 1U | ((ch->psk).field_0xb4 & 1) == 0)) {
              uVar12 = local_e0 - (local_a0 + (*(int *)&ppVar1[1].base - local_10c));
              uVar17 = -uVar12;
              if (0 < (long)uVar12) {
                uVar17 = uVar12;
              }
              if ((ppVar4->max_early_data_size != 0) && (uVar17 < 0x2711)) {
                *local_118 = 1;
              }
            }
            if (((ppVar4->ticket_context).field_0x20 & 1) == 0) {
              if (local_c0.len == 0) {
                if (tls->server_name == (char *)0x0) goto LAB_0012fa85;
              }
              else {
                pcVar14 = tls->server_name;
                if (pcVar14 != (char *)0x0) {
                  iVar10 = strncmp((char *)local_c0.base,pcVar14,local_c0.len);
                  if (iVar10 != 0) goto LAB_0012f916;
                  if (pcVar14[sVar8] == '\0') goto LAB_0012fa85;
                }
              }
            }
            else if ((local_c0.len == 0x20) &&
                    (auVar21[0] = -((ppVar4->ticket_context).bytes[0] == *local_c0.base),
                    auVar21[1] = -((ppVar4->ticket_context).bytes[1] == local_c0.base[1]),
                    auVar21[2] = -((ppVar4->ticket_context).bytes[2] == local_c0.base[2]),
                    auVar21[3] = -((ppVar4->ticket_context).bytes[3] == local_c0.base[3]),
                    auVar21[4] = -((ppVar4->ticket_context).bytes[4] == local_c0.base[4]),
                    auVar21[5] = -((ppVar4->ticket_context).bytes[5] == local_c0.base[5]),
                    auVar21[6] = -((ppVar4->ticket_context).bytes[6] == local_c0.base[6]),
                    auVar21[7] = -((ppVar4->ticket_context).bytes[7] == local_c0.base[7]),
                    auVar21[8] = -((ppVar4->ticket_context).bytes[8] == local_c0.base[8]),
                    auVar21[9] = -((ppVar4->ticket_context).bytes[9] == local_c0.base[9]),
                    auVar21[10] = -((ppVar4->ticket_context).bytes[10] == local_c0.base[10]),
                    auVar21[0xb] = -((ppVar4->ticket_context).bytes[0xb] == local_c0.base[0xb]),
                    auVar21[0xc] = -((ppVar4->ticket_context).bytes[0xc] == local_c0.base[0xc]),
                    auVar21[0xd] = -((ppVar4->ticket_context).bytes[0xd] == local_c0.base[0xd]),
                    auVar21[0xe] = -((ppVar4->ticket_context).bytes[0xe] == local_c0.base[0xe]),
                    auVar21[0xf] = -((ppVar4->ticket_context).bytes[0xf] == local_c0.base[0xf]),
                    auVar20[0] = -((ppVar4->ticket_context).bytes[0x10] == local_c0.base[0x10]),
                    auVar20[1] = -((ppVar4->ticket_context).bytes[0x11] == local_c0.base[0x11]),
                    auVar20[2] = -((ppVar4->ticket_context).bytes[0x12] == local_c0.base[0x12]),
                    auVar20[3] = -((ppVar4->ticket_context).bytes[0x13] == local_c0.base[0x13]),
                    auVar20[4] = -((ppVar4->ticket_context).bytes[0x14] == local_c0.base[0x14]),
                    auVar20[5] = -((ppVar4->ticket_context).bytes[0x15] == local_c0.base[0x15]),
                    auVar20[6] = -((ppVar4->ticket_context).bytes[0x16] == local_c0.base[0x16]),
                    auVar20[7] = -((ppVar4->ticket_context).bytes[0x17] == local_c0.base[0x17]),
                    auVar20[8] = -((ppVar4->ticket_context).bytes[0x18] == local_c0.base[0x18]),
                    auVar20[9] = -((ppVar4->ticket_context).bytes[0x19] == local_c0.base[0x19]),
                    auVar20[10] = -((ppVar4->ticket_context).bytes[0x1a] == local_c0.base[0x1a]),
                    auVar20[0xb] = -((ppVar4->ticket_context).bytes[0x1b] == local_c0.base[0x1b]),
                    auVar20[0xc] = -((ppVar4->ticket_context).bytes[0x1c] == local_c0.base[0x1c]),
                    auVar20[0xd] = -((ppVar4->ticket_context).bytes[0x1d] == local_c0.base[0x1d]),
                    auVar20[0xe] = -((ppVar4->ticket_context).bytes[0x1e] == local_c0.base[0x1e]),
                    auVar20[0xf] = -((ppVar4->ticket_context).bytes[0x1f] == local_c0.base[0x1f]),
                    auVar20 = auVar20 & auVar21,
                    (ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff)) {
LAB_0012fa85:
              sVar8 = local_98.len;
              pppVar13 = ppVar4->key_exchanges;
              ppVar7 = *pppVar13;
              bVar15 = 4;
              bVar19 = ppVar7 == (ptls_key_exchange_algorithm_t *)0x0;
              if (!bVar19) {
                uVar2 = ppVar7->id;
                while (uVar2 != local_11a) {
                  pppVar13 = pppVar13 + 1;
                  ppVar7 = *pppVar13;
                  bVar19 = ppVar7 == (ptls_key_exchange_algorithm_t *)0x0;
                  if (bVar19) goto LAB_0012fad6;
                  uVar2 = ppVar7->id;
                }
                if (!bVar19) {
                  tls->key_share = ppVar7;
                  bVar15 = 0;
                }
              }
LAB_0012fad6:
              if (!bVar19) {
                bVar15 = 4;
                if (local_11c != tls->cipher_suite->id) goto LAB_0012f916;
                if (local_98.len == 0) {
LAB_0012fb4b:
                  sVar8 = (tls->key_schedule->hashes[0].algo)->digest_size;
                  if (local_d8.len == sVar8) {
                    bVar15 = (ch->psk).identities.list[*psk_index].binder.len == sVar8 | 4;
                  }
                }
                else {
                  pcVar14 = tls->negotiated_protocol;
                  if (pcVar14 != (char *)0x0) {
                    iVar10 = strncmp((char *)local_98.base,pcVar14,local_98.len);
                    if (iVar10 != 0) goto LAB_0012f916;
                    if (pcVar14[sVar8] == '\0') goto LAB_0012fb4b;
                  }
                }
              }
            }
            goto LAB_0012f91b;
          }
        }
        else if (iVar10 == 0x209) {
          bVar19 = false;
          goto LAB_0012f8c1;
        }
LAB_0012f916:
        bVar15 = 4;
      }
    }
    else {
      bVar15 = 4;
      if ((ppVar1->len == (ppVar4->pre_shared_key).identity.len) &&
         (iVar10 = bcmp(ppVar1->base,puVar5,ppVar1->len), iVar10 == 0)) {
        *local_118 = (uint)(byte)(uVar17 == 0 & (ch->psk).field_0xb4);
        tls->key_share = (ptls_key_exchange_algorithm_t *)0x0;
        local_d8.base = (ppVar4->pre_shared_key).secret.base;
        local_d8.len = (ppVar4->pre_shared_key).secret.len;
        bVar15 = 5;
      }
    }
LAB_0012f91b:
    if (bVar15 == 4) goto code_r0x0012f925;
    if (bVar15 != 5) goto LAB_0012fd35;
    if ((is_second_flight != 0) ||
       (ikm.len = local_d8.len, ikm.base = local_d8.base,
       uVar11 = key_schedule_extract(tls->key_schedule,ikm), uVar11 == 0)) {
      pcVar14 = "ext binder";
      if ((tls->ctx->pre_shared_key).secret.base == (uint8_t *)0x0) {
        pcVar14 = "res binder";
      }
      algo = tls->key_schedule->hashes[0].algo;
      local_88 = algo->empty_digest;
      sStack_80 = algo->digest_size;
      secret_00.base = tls->key_schedule->secret;
      hash_value.len = sStack_80;
      hash_value.base = local_88;
      secret_00.len = sStack_80;
      uVar11 = ptls_hkdf_expand_label
                         (algo,local_78,sStack_80,secret_00,pcVar14,hash_value,(char *)0x0);
      sVar8 = local_a8;
      puVar5 = local_b0;
      if (uVar11 == 0) {
        ppVar9 = tls->key_schedule;
        if (ppVar9->num_hashes != 0) {
          pppVar18 = &ppVar9->hashes[0].ctx;
          sVar16 = 0;
          do {
            (*(*pppVar18)->update)(*pppVar18,puVar5,sVar8);
            sVar16 = sVar16 + 1;
            pppVar18 = pppVar18 + 3;
          } while (sVar16 != ppVar9->num_hashes);
        }
        uVar11 = calc_verify_data(local_78,tls->key_schedule,local_78);
        if (uVar11 == 0) {
          iVar10 = (*ptls_mem_equal)((ch->psk).identities.list[*psk_index].binder.base,local_78,
                                     (tls->key_schedule->hashes[0].algo)->digest_size);
          ch = (st_ptls_client_hello_t *)0x33;
          if (iVar10 != 0) {
            ch = (st_ptls_client_hello_t *)0x0;
          }
          goto LAB_0012fceb;
        }
      }
    }
    ch = (st_ptls_client_hello_t *)(ulong)uVar11;
  }
LAB_0012fceb:
  (*ptls_clear_memory)(local_108.base,local_108.off);
  if (local_108.is_allocated != '\0') {
    free(local_108.base);
  }
  local_108.off = 0;
  local_108.is_allocated = '\0';
  local_108.align_bits = '\0';
  local_108._26_6_ = 0;
  local_108.base = (uint8_t *)0x0;
  local_108.capacity = 0;
  (*ptls_clear_memory)(local_78,0x40);
LAB_0012fd35:
  return (int)ch;
code_r0x0012f925:
  uVar17 = *psk_index + 1;
  *psk_index = uVar17;
  if ((ch->psk).identities.count <= uVar17) goto LAB_0012fb88;
  goto LAB_0012f7f4;
}

Assistant:

static int try_psk_handshake(ptls_t *tls, size_t *psk_index, int *accept_early_data, struct st_ptls_client_hello_t *ch,
                             ptls_iovec_t ch_trunc, int is_second_flight)
{
    ptls_buffer_t decbuf;
    ptls_iovec_t secret, ticket_ctx, ticket_negotiated_protocol;
    uint64_t issue_at, now = tls->ctx->get_time->cb(tls->ctx->get_time);
    uint32_t age_add;
    uint16_t ticket_key_exchange_id, ticket_csid;
    uint8_t binder_key[PTLS_MAX_DIGEST_SIZE];
    int ret;

    ptls_buffer_init(&decbuf, "", 0);

    for (*psk_index = 0; *psk_index < ch->psk.identities.count; ++*psk_index) {
        ptls_client_hello_psk_identity_t *identity = ch->psk.identities.list + *psk_index;

        /* negotiate using fixed pre-shared key */
        if (tls->ctx->pre_shared_key.identity.base != NULL) {
            if (identity->identity.len == tls->ctx->pre_shared_key.identity.len &&
                memcmp(identity->identity.base, tls->ctx->pre_shared_key.identity.base, identity->identity.len) == 0) {
                *accept_early_data = ch->psk.early_data_indication && *psk_index == 0;
                tls->key_share = NULL;
                secret = tls->ctx->pre_shared_key.secret;
                goto Found;
            }
            continue;
        }

        /* decrypt ticket and decode */
        if (tls->ctx->encrypt_ticket == NULL || tls->ctx->key_exchanges == NULL)
            continue;
        int can_accept_early_data = *psk_index == 0;
        decbuf.off = 0;
        switch (tls->ctx->encrypt_ticket->cb(tls->ctx->encrypt_ticket, tls, 0, &decbuf, identity->identity)) {
        case 0: /* decrypted */
            break;
        case PTLS_ERROR_REJECT_EARLY_DATA: /* decrypted, but early data is rejected */
            can_accept_early_data = 0;
            break;
        default: /* decryption failure */
            continue;
        }
        if (decode_session_identifier(&issue_at, &secret, &age_add, &ticket_ctx, &ticket_key_exchange_id, &ticket_csid,
                                      &ticket_negotiated_protocol, decbuf.base, decbuf.base + decbuf.off) != 0)
            continue;
        /* check age */
        if (now < issue_at)
            continue;
        if (now - issue_at > (uint64_t)tls->ctx->ticket_lifetime * 1000)
            continue;
        *accept_early_data = 0;
        if (ch->psk.early_data_indication && can_accept_early_data) {
            /* accept early-data if abs(diff) between the reported age and the actual age is within += 10 seconds */
            int64_t delta = (now - issue_at) - (identity->obfuscated_ticket_age - age_add);
            if (delta < 0)
                delta = -delta;
            if (tls->ctx->max_early_data_size != 0 && delta <= PTLS_EARLY_DATA_MAX_DELAY)
                *accept_early_data = 1;
        }
        /* check ticket context */
        if (tls->ctx->ticket_context.is_set) {
            if (!(ticket_ctx.len == sizeof(tls->ctx->ticket_context.bytes) &&
                  memcmp(ticket_ctx.base, tls->ctx->ticket_context.bytes, ticket_ctx.len) == 0))
                continue;
        } else {
            /* check server-name */
            if (ticket_ctx.len != 0) {
                if (tls->server_name == NULL)
                    continue;
                if (!vec_is_string(ticket_ctx, tls->server_name))
                    continue;
            } else {
                if (tls->server_name != NULL)
                    continue;
            }
        }
        { /* check key-exchange */
            ptls_key_exchange_algorithm_t **a;
            for (a = tls->ctx->key_exchanges; *a != NULL && (*a)->id != ticket_key_exchange_id; ++a)
                ;
            if (*a == NULL)
                continue;
            tls->key_share = *a;
        }
        /* check cipher-suite */
        if (ticket_csid != tls->cipher_suite->id)
            continue;
        /* check negotiated-protocol */
        if (ticket_negotiated_protocol.len != 0) {
            if (tls->negotiated_protocol == NULL)
                continue;
            if (!vec_is_string(ticket_negotiated_protocol, tls->negotiated_protocol))
                continue;
        }
        /* check the length of the decrypted psk and the PSK binder */
        if (secret.len != tls->key_schedule->hashes[0].algo->digest_size)
            continue;
        if (ch->psk.identities.list[*psk_index].binder.len != tls->key_schedule->hashes[0].algo->digest_size)
            continue;

        /* found */
        goto Found;
    }

    /* not found */
    *psk_index = SIZE_MAX;
    *accept_early_data = 0;
    tls->key_share = NULL;
    ret = 0;
    goto Exit;

Found:
    if (!is_second_flight && (ret = key_schedule_extract(tls->key_schedule, secret)) != 0)
        goto Exit;
    if ((ret = derive_secret_with_empty_digest(tls->key_schedule, binder_key,
                                               tls->ctx->pre_shared_key.secret.base != NULL ? "ext binder" : "res binder")) != 0)
        goto Exit;
    ptls__key_schedule_update_hash(tls->key_schedule, ch_trunc.base, ch_trunc.len, 0);
    if ((ret = calc_verify_data(binder_key /* to conserve space, reuse binder_key for storing verify_data */, tls->key_schedule,
                                binder_key)) != 0)
        goto Exit;
    if (!ptls_mem_equal(ch->psk.identities.list[*psk_index].binder.base, binder_key,
                        tls->key_schedule->hashes[0].algo->digest_size)) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    ret = 0;

Exit:
    ptls_buffer_dispose(&decbuf);
    ptls_clear_memory(binder_key, sizeof(binder_key));
    return ret;
}